

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O0

Bitmap __thiscall
lunasvg::Document::renderToBitmap(Document *this,int width,int height,uint32_t backgroundColor)

{
  pointer pSVar1;
  SVGRootElement *this_00;
  undefined4 in_register_00000034;
  unique_ptr<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_> *this_01;
  uint32_t in_R8D;
  float fVar2;
  float fVar3;
  double dVar4;
  undefined1 local_4c [8];
  Matrix matrix;
  float yScale;
  float xScale;
  float intrinsicHeight;
  float intrinsicWidth;
  uint32_t backgroundColor_local;
  int height_local;
  int width_local;
  Document *this_local;
  Bitmap *bitmap;
  
  this_01 = (unique_ptr<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_> *)
            CONCAT44(in_register_00000034,width);
  pSVar1 = std::unique_ptr<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>::
           operator->(this_01);
  this_00 = SVGRootElement::updateLayout(pSVar1);
  fVar2 = SVGRootElement::intrinsicWidth(this_00);
  pSVar1 = std::unique_ptr<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>::
           operator->(this_01);
  fVar3 = SVGRootElement::intrinsicHeight(pSVar1);
  if (((fVar2 == 0.0) && (!NAN(fVar2))) || ((fVar3 == 0.0 && (!NAN(fVar3))))) {
    memset(this,0,8);
    Bitmap::Bitmap((Bitmap *)this);
  }
  else {
    if ((height < 1) && ((int)backgroundColor < 1)) {
      dVar4 = std::ceil((double)(ulong)(uint)fVar2);
      backgroundColor_local = (uint32_t)SUB84(dVar4,0);
      dVar4 = std::ceil((double)(ulong)(uint)fVar3);
      intrinsicWidth = (float)(int)SUB84(dVar4,0);
    }
    else {
      backgroundColor_local = height;
      if ((height < 1) || (0 < (int)backgroundColor)) {
        intrinsicWidth = (float)backgroundColor;
        if ((0 < (int)backgroundColor) && (height < 1)) {
          dVar4 = std::ceil((double)(ulong)(uint)(((float)(int)backgroundColor * fVar2) / fVar3));
          backgroundColor_local = (uint32_t)SUB84(dVar4,0);
        }
      }
      else {
        dVar4 = std::ceil((double)(ulong)(uint)(((float)height * fVar3) / fVar2));
        intrinsicWidth = (float)(int)SUB84(dVar4,0);
      }
    }
    matrix.f = (float)(int)backgroundColor_local / fVar2;
    matrix.e = (float)(int)intrinsicWidth / fVar3;
    Matrix::Matrix((Matrix *)local_4c,matrix.f,0.0,0.0,matrix.e,0.0,0.0);
    Bitmap::Bitmap((Bitmap *)this,backgroundColor_local,(int)intrinsicWidth);
    Bitmap::clear((Bitmap *)this,in_R8D);
    render((Document *)this_01,(Bitmap *)this,(Matrix *)local_4c);
  }
  return (Bitmap)(plutovg_surface_t *)this;
}

Assistant:

Bitmap Document::renderToBitmap(int width, int height, uint32_t backgroundColor) const
{
    auto intrinsicWidth = m_rootElement->updateLayout()->intrinsicWidth();
    auto intrinsicHeight = m_rootElement->intrinsicHeight();
    if(intrinsicWidth == 0.f || intrinsicHeight == 0.f)
        return Bitmap();
    if(width <= 0 && height <= 0) {
        width = static_cast<int>(std::ceil(intrinsicWidth));
        height = static_cast<int>(std::ceil(intrinsicHeight));
    } else if(width > 0 && height <= 0) {
        height = static_cast<int>(std::ceil(width * intrinsicHeight / intrinsicWidth));
    } else if(height > 0 && width <= 0) {
        width = static_cast<int>(std::ceil(height * intrinsicWidth / intrinsicHeight));
    }

    auto xScale = width / intrinsicWidth;
    auto yScale = height / intrinsicHeight;

    Matrix matrix(xScale, 0, 0, yScale, 0, 0);
    Bitmap bitmap(width, height);
    bitmap.clear(backgroundColor);
    render(bitmap, matrix);
    return bitmap;
}